

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_utxoutil.cpp
# Opt level: O2

void __thiscall
UtxoUtil_ConvertToUtxo_Test::~UtxoUtil_ConvertToUtxo_Test(UtxoUtil_ConvertToUtxo_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(UtxoUtil, ConvertToUtxo)
{
  UtxoData utxo1;
  utxo1.txid = Txid("9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a");
  utxo1.vout = 1;
  utxo1.address_type = AddressType::kP2wpkhAddress;

  Utxo utxo;
  memset(&utxo, 0, sizeof(utxo));
  UtxoData dest;

  EXPECT_NO_THROW((UtxoUtil::ConvertToUtxo(utxo1, &utxo, &dest)));
  EXPECT_TRUE((memcmp(utxo.txid, utxo1.txid.GetData().GetBytes().data(), sizeof(utxo.txid)) == 0));
  EXPECT_EQ(utxo.vout, utxo1.vout);
  EXPECT_STREQ(dest.txid.GetData().GetHex().c_str(),
               utxo1.txid.GetData().GetHex().c_str());
  EXPECT_EQ(dest.vout, utxo1.vout);
}